

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ArrayFeatureType::InternalSwap
          (ArrayFeatureType *this,ArrayFeatureType *other)

{
  DefaultOptionalValueUnion DVar1;
  int iVar2;
  uint32_t uVar3;
  intptr_t iVar4;
  ShapeFlexibilityUnion SVar5;
  
  iVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar4;
  google::protobuf::RepeatedField<long>::InternalSwap(&this->shape_,&other->shape_);
  iVar2 = this->datatype_;
  this->datatype_ = other->datatype_;
  other->datatype_ = iVar2;
  SVar5 = this->ShapeFlexibility_;
  this->ShapeFlexibility_ = other->ShapeFlexibility_;
  other->ShapeFlexibility_ = SVar5;
  DVar1 = this->defaultOptionalValue_;
  this->defaultOptionalValue_ = other->defaultOptionalValue_;
  other->defaultOptionalValue_ = DVar1;
  uVar3 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar3;
  uVar3 = this->_oneof_case_[1];
  this->_oneof_case_[1] = other->_oneof_case_[1];
  other->_oneof_case_[1] = uVar3;
  return;
}

Assistant:

void ArrayFeatureType::InternalSwap(ArrayFeatureType* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  shape_.InternalSwap(&other->shape_);
  swap(datatype_, other->datatype_);
  swap(ShapeFlexibility_, other->ShapeFlexibility_);
  swap(defaultOptionalValue_, other->defaultOptionalValue_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
  swap(_oneof_case_[1], other->_oneof_case_[1]);
}